

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O0

void __thiscall
YacclabTests::SaveAverageWithStepsResults
          (YacclabTests *this,string *os_name,string *dataset_name,bool rounded)

{
  byte bVar1;
  _Setprecision _Var2;
  StreamDemultiplexer *this_00;
  ostream *poVar3;
  double *pdVar4;
  double dVar5;
  int local_2cc;
  string local_2c8 [4];
  int c;
  string local_2a8 [32];
  double local_288;
  double cumulative_sum;
  value_type *algo_name;
  mapped_type *pmStack_270;
  int r;
  mapped_type *results;
  int local_244;
  int local_240;
  StepType step;
  int step_number;
  ostream local_228 [8];
  ofstream os;
  bool rounded_local;
  string *dataset_name_local;
  string *os_name_local;
  YacclabTests *this_local;
  
  std::ofstream::ofstream(local_228,(string *)os_name,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = StreamDemultiplexer::operator<<
                        ((StreamDemultiplexer *)dmux::cout,
                         (char (*) [31])"Unable to save average results");
    step_number._3_1_ = 10;
    StreamDemultiplexer::operator<<(this_00,(char *)((long)&step_number + 3));
    step = FIRST_SCAN;
  }
  else {
    poVar3 = std::operator<<(local_228,"#Algorithm");
    std::operator<<(poVar3,'\t');
    for (local_240 = 0; local_240 != 4; local_240 = local_240 + 1) {
      local_244 = local_240;
      Step_abi_cxx11_((StepType)&results);
      poVar3 = std::operator<<(local_228,(string *)&results);
      std::operator<<(poVar3,'\t');
      std::__cxx11::string::~string((string *)&results);
    }
    poVar3 = std::operator<<(local_228,"Total");
    std::operator<<(poVar3,'\n');
    pmStack_270 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat_<double>_>_>_>
                  ::at(&this->average_ws_results_,dataset_name);
    for (algo_name._4_4_ = 0; algo_name._4_4_ < *(int *)&pmStack_270->field_0x8;
        algo_name._4_4_ = algo_name._4_4_ + 1) {
      cumulative_sum =
           (double)std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->mode_cfg_->ccl_average_ws_algorithms,(long)algo_name._4_4_);
      local_288 = 0.0;
      std::__cxx11::string::string(local_2c8,(string *)cumulative_sum);
      DoubleEscapeUnderscore(local_2a8);
      poVar3 = std::operator<<(local_228,(string *)local_2a8);
      std::operator<<(poVar3,'\t');
      std::__cxx11::string::~string((string *)local_2a8);
      std::__cxx11::string::~string(local_2c8);
      for (local_2cc = 0; local_2cc < *(int *)&pmStack_270->field_0xc; local_2cc = local_2cc + 1) {
        if (rounded) {
          pdVar4 = cv::Mat_<double>::operator()(pmStack_270,algo_name._4_4_,local_2cc);
          dVar5 = floor(*pdVar4 * 100.0 + 0.5);
          local_288 = local_288 + dVar5 / 100.0;
          poVar3 = (ostream *)std::ostream::operator<<(local_228,std::fixed);
          _Var2 = std::setprecision(2);
          poVar3 = std::operator<<(poVar3,_Var2);
          pdVar4 = cv::Mat_<double>::operator()(pmStack_270,algo_name._4_4_,local_2cc);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar4);
          std::operator<<(poVar3,'\t');
        }
        else {
          pdVar4 = cv::Mat_<double>::operator()(pmStack_270,algo_name._4_4_,local_2cc);
          local_288 = local_288 + *pdVar4;
          poVar3 = (ostream *)std::ostream::operator<<(local_228,std::fixed);
          _Var2 = std::setprecision(8);
          poVar3 = std::operator<<(poVar3,_Var2);
          pdVar4 = cv::Mat_<double>::operator()(pmStack_270,algo_name._4_4_,local_2cc);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar4);
          std::operator<<(poVar3,'\t');
        }
      }
      if (rounded) {
        poVar3 = (ostream *)std::ostream::operator<<(local_228,std::fixed);
        _Var2 = std::setprecision(2);
        poVar3 = std::operator<<(poVar3,_Var2);
        std::ostream::operator<<(poVar3,local_288);
      }
      else {
        poVar3 = (ostream *)std::ostream::operator<<(local_228,std::fixed);
        _Var2 = std::setprecision(8);
        poVar3 = std::operator<<(poVar3,_Var2);
        std::ostream::operator<<(poVar3,local_288);
      }
      std::operator<<(local_228,'\n');
    }
    std::ofstream::close();
    step = ALLOC_DEALLOC;
  }
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void YacclabTests::SaveAverageWithStepsResults(const std::string& os_name, const std::string& dataset_name, bool rounded) {
    std::ofstream os(os_name);
    if (!os.is_open()) {
        dmux::cout << "Unable to save average results" << '\n';
        return;
    }

    // Write heading string in output stream
    os << "#Algorithm" << '\t';
    for (int step_number = 0; step_number != StepType::ST_SIZE; ++step_number) {
        StepType step = static_cast<StepType>(step_number);
        os << Step(step) << '\t';
    }
    os << "Total" << '\n';

    const auto& results = average_ws_results_.at(dataset_name);

    for (int r = 0; r < results.rows; ++r) {
        const auto& algo_name = mode_cfg_.ccl_average_ws_algorithms[r];
        double cumulative_sum{ 0.0 };

        // Gnuplot requires double-escaped name when underscores are encountered
        //{
        //    string algo_name_double_escaped{ algo_name };
        //    std::size_t found = algo_name_double_escaped.find_first_of("_");
        //    while (found != std::string::npos) {
        //        algo_name_double_escaped.insert(found, "\\\\");
        //        found = algo_name_double_escaped.find_first_of("_", found + 3);
        //    }
        //    os << algo_name_double_escaped << '\t';
        //}
        os << DoubleEscapeUnderscore(std::string(algo_name)) << '\t';

        for (int c = 0; c < results.cols; ++c) {
            if (rounded) {
                cumulative_sum += floor(results(r, c) * 100.00 + 0.5) / 100.00;
                os << std::fixed << std::setprecision(2) << results(r, c) << '\t';
            }
            else {
                cumulative_sum += results(r, c);
                os << std::fixed << std::setprecision(8) << results(r, c) << '\t';
            }
        }
        // Write cumulative_sum as total
        if (rounded) {
            os << std::fixed << std::setprecision(2) << cumulative_sum;
        }
        else {
            os << std::fixed << std::setprecision(8) << cumulative_sum;
        }
        os << '\n';
    }
    os.close();
}